

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

void set_obj_names(_Bool terse,player *p)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  uint32_t mode;
  long lVar7;
  char *buf;
  
  if (L'\0' < num_obj) {
    buf = items[0].o_name;
    lVar7 = 0;
    do {
      if (*(object **)(buf + -8) == (object *)0x0) {
        if (num_head <= lVar7) {
          iVar2 = strcmp(buf + -0xa8,"In quiver");
          if (iVar2 != 0) {
            strnfmt(buf,0x50,"(nothing)");
            goto LAB_001fae9c;
          }
        }
        strnfmt(buf,0x50,"%s","");
      }
      else {
        if (terse) {
          mode = 0x143;
        }
        else {
          mode = 0x43;
        }
        object_desc(buf,0x50,*(object **)(buf + -8),mode,p);
      }
LAB_001fae9c:
      sVar1 = max_len;
      sVar3 = strlen((char *)(buf + -0xa8));
      sVar4 = strlen(buf + -0x58);
      sVar5 = strlen(buf);
      uVar6 = sVar5 + sVar4 + sVar3;
      max_len = sVar1;
      if (sVar1 <= uVar6) {
        max_len = uVar6;
      }
      lVar7 = lVar7 + 1;
      buf = buf + 0x100;
    } while (lVar7 < num_obj);
  }
  return;
}

Assistant:

static void set_obj_names(bool terse, const struct player *p)
{
	int i;
	struct object *obj;

	/* Calculate name offset and max name length */
	for (i = 0; i < num_obj; i++) {
		obj = items[i].object;

		/* Null objects are used to skip lines, or display only a label */		
		if (!obj) {
			if ((i < num_head) || streq(items[i].label, "In quiver"))
				strnfmt(items[i].o_name, sizeof(items[i].o_name), "%s", "");
			else
				strnfmt(items[i].o_name, sizeof(items[i].o_name), "(nothing)");
		} else {
			if (terse) {
				object_desc(items[i].o_name,
					sizeof(items[i].o_name), obj,
					ODESC_PREFIX | ODESC_FULL | ODESC_TERSE,
					p);
			} else {
				object_desc(items[i].o_name,
					sizeof(items[i].o_name), obj,
					ODESC_PREFIX | ODESC_FULL, p);
			}
		}

		/* Max length of label + object name */
		max_len = MAX(max_len,
					  strlen(items[i].label) + strlen(items[i].equip_label) +
					  strlen(items[i].o_name));
	}
}